

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::retrain(FastText *this,Args *args)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  int *in_RDI;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff28;
  Model *in_stack_ffffffffffffff30;
  Matrix *in_stack_ffffffffffffff40;
  Args *in_stack_ffffffffffffff58;
  shared_ptr<fasttext::Args> *in_stack_ffffffffffffff60;
  shared_ptr<fasttext::Matrix> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  entry_type in_stack_ffffffffffffff77;
  Dictionary *in_stack_ffffffffffffff78;
  FastText *in_stack_ffffffffffffffc0;
  
  std::make_shared<fasttext::Args,fasttext::Args_const&>(in_stack_ffffffffffffff58);
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x167aa8);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x167ab2);
  if (peVar1->model == sup) {
    peVar2 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x167ac9);
    Dictionary::nlabels(peVar2);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x167ae2);
    std::make_shared<fasttext::Matrix,int,int&>((int *)in_stack_ffffffffffffff58,in_RDI);
    std::shared_ptr<fasttext::Matrix>::operator=
              (&in_stack_ffffffffffffff30->wi_,
               (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff28);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x167b21);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x167b31);
    Dictionary::nwords(peVar2);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x167b4a);
    std::make_shared<fasttext::Matrix,int,int&>((int *)in_stack_ffffffffffffff58,in_RDI);
    std::shared_ptr<fasttext::Matrix>::operator=
              (&in_stack_ffffffffffffff30->wi_,
               (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff28);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x167b89);
  }
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x167b97);
  Matrix::zero(in_stack_ffffffffffffff40);
  startThreads(in_stack_ffffffffffffffc0);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff78,
             (shared_ptr<fasttext::Matrix> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::Model> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x167bf7);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x167c01);
  if (peVar1->model == sup) {
    peVar3 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x167c18);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x167c2b);
    Dictionary::getCounts(in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
    Model::setTargetCounts(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)peVar3)
    ;
  }
  else {
    peVar3 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x167c8a);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x167c9d);
    Dictionary::getCounts(in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
    Model::setTargetCounts(peVar3,in_stack_ffffffffffffff28);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void FastText::retrain(const Args& args)
{	
	args_ = std::make_shared<Args>(args);
	if (args_->model == model_name::sup) {
		output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
	} else {
		output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
	}
	output_->zero();
	startThreads();
	model_ = std::make_shared<Model>(input_, output_, weights_, args_, 0);
	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}